

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp9d_parser2_syntax.c
# Opt level: O3

RK_S32 vp9d_parser2_syntax(Vp9CodecContext *ctx)

{
  RK_U8 (*paRVar1) [9];
  DXVA_PicEntry_VPx DVar2;
  void *pvVar3;
  ushort uVar4;
  RK_S32 RVar5;
  UCHAR UVar6;
  byte bVar7;
  byte bVar8;
  ushort uVar9;
  RK_U32 RVar10;
  byte *pbVar11;
  byte bVar12;
  byte bVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  RK_U8 (*paaRVar20) [4] [3];
  undefined8 *puVar21;
  UCHAR (*paUVar22) [9];
  int iVar23;
  RK_U8 (*paRVar24) [9];
  UCHAR (*paUVar25) [9];
  long lVar26;
  bool bVar27;
  byte bVar28;
  undefined1 auVar29 [16];
  RK_U8 partition_probs_delata [16] [3];
  RK_U8 partition_probs_flag [16] [3];
  RK_U8 partition_probs [16] [3];
  RK_U8 uv_mode_prob [10] [9];
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  UCHAR aUStack_80 [80];
  undefined2 local_30;
  
  bVar28 = 0;
  pvVar3 = ctx->priv_data;
  (ctx->pic_params).profile = (UCHAR)ctx->profile;
  uVar9 = (ctx->pic_params).field_2.wFormatAndPictureInfoFlags;
  uVar14 = (*(byte *)((long)pvVar3 + 0xd0) & 1) << 0xe;
  (ctx->pic_params).field_2.wFormatAndPictureInfoFlags = uVar9 & 0xbfff | uVar14;
  bVar27 = *(char *)((long)pvVar3 + 0xd1) == '\0';
  (ctx->pic_params).field_2.wFormatAndPictureInfoFlags = uVar9 & 0xbffe | uVar14 | (ushort)bVar27;
  uVar9 = (uVar9 & 0xbffc | uVar14 | (ushort)bVar27) +
          (ushort)(*(char *)((long)pvVar3 + 0xd7) == '\0') * 2;
  (ctx->pic_params).field_2.wFormatAndPictureInfoFlags = uVar9;
  uVar9 = (uVar9 & 0xfffb) + (*(byte *)((long)pvVar3 + 0xd9) & 1) * 4;
  (ctx->pic_params).field_2.wFormatAndPictureInfoFlags = uVar9;
  uVar9 = (uVar9 & 0xfff7) + (*(byte *)((long)pvVar3 + 0xda) & 1) * 8;
  (ctx->pic_params).field_2.wFormatAndPictureInfoFlags = uVar9;
  uVar15 = (*(byte *)((long)pvVar3 + 0xdb) & 1) << 4;
  (ctx->pic_params).field_2.wFormatAndPictureInfoFlags = uVar9 & 0xffef | uVar15;
  uVar14 = (ushort)((*(uint *)((long)pvVar3 + 0xdc) & 1) << 5);
  (ctx->pic_params).field_2.wFormatAndPictureInfoFlags = uVar9 & 0xffcf | uVar15 | uVar14;
  uVar16 = (*(byte *)((long)pvVar3 + 0xea) & 1) << 6;
  (ctx->pic_params).field_2.wFormatAndPictureInfoFlags = uVar9 & 0xff8f | uVar15 | uVar14 | uVar16;
  bVar12 = *(char *)((long)pvVar3 + 0xdd) << 7;
  (ctx->pic_params).field_2.wFormatAndPictureInfoFlags =
       uVar9 & 0xff0f | uVar15 | uVar14 | uVar16 | (ushort)bVar12;
  uVar17 = (*(byte *)((long)pvVar3 + 0xec) & 3) << 8;
  (ctx->pic_params).field_2.wFormatAndPictureInfoFlags =
       uVar9 & 0xfc0f | uVar15 | uVar14 | uVar16 | (ushort)bVar12 | uVar17;
  uVar18 = (*(byte *)((long)pvVar3 + 0xde) & 3) << 10;
  uVar4 = (ushort)bVar12;
  (ctx->pic_params).field_2.wFormatAndPictureInfoFlags =
       uVar9 & 0xf00f | uVar15 | uVar14 | uVar16 | uVar4 | uVar17 | uVar18;
  uVar19 = (*(byte *)((long)pvVar3 + 0xe0) & 1) << 0xc;
  (ctx->pic_params).field_2.wFormatAndPictureInfoFlags =
       uVar9 & 0xe00f | uVar15 | uVar14 | uVar16 | uVar4 | uVar17 | uVar18 | uVar19;
  (ctx->pic_params).field_2.wFormatAndPictureInfoFlags =
       uVar9 & 0xc00f | uVar15 | uVar14 | uVar16 | uVar4 | uVar17 | uVar18 | uVar19 |
       (*(byte *)((long)pvVar3 + 0xeb) & 1) << 0xd;
  RVar5 = ctx->height;
  (ctx->pic_params).width = ctx->width;
  (ctx->pic_params).height = RVar5;
  UVar6 = *(char *)((long)pvVar3 + 0xd4) + 0xf8;
  (ctx->pic_params).BitDepthMinus8Luma = UVar6;
  (ctx->pic_params).BitDepthMinus8Chroma = UVar6;
  (ctx->pic_params).interp_filter = *(UCHAR *)((long)pvVar3 + 0xe4);
  (ctx->pic_params).CurrPic.field_0.bPicEntry =
       (ctx->pic_params).CurrPic.field_0.bPicEntry & 0x80 | *(byte *)((long)pvVar3 + 0x100) & 0x7f;
  puVar21 = (undefined8 *)((long)pvVar3 + 0x140);
  lVar26 = 0;
  do {
    (ctx->pic_params).ref_frame_map[lVar26].field_0 =
         (anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_VPx_0)
         ((ctx->pic_params).ref_frame_map[lVar26].field_0.bPicEntry & 0x80 |
         *(byte *)(puVar21 + 1) & 0x7f);
    RVar10 = mpp_frame_get_width((MppFrame)*puVar21);
    (ctx->pic_params).ref_frame_coded_width[lVar26] = RVar10;
    RVar10 = mpp_frame_get_height((MppFrame)*puVar21);
    (ctx->pic_params).ref_frame_coded_height[lVar26] = RVar10;
    lVar26 = lVar26 + 1;
    puVar21 = puVar21 + 3;
  } while (lVar26 != 8);
  DVar2.field_0 =
       (anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_VPx_0)
       (ctx->pic_params).frame_refs[1].field_0.bPicEntry;
  (ctx->pic_params).frame_refs[0].field_0.bPicEntry =
       (ctx->pic_params).frame_refs[0].field_0.bPicEntry & 0x80 |
       *(byte *)((long)pvVar3 + 0xed) & 0x7f;
  (ctx->pic_params).frame_refs[1].field_0 =
       (anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_VPx_0)
       ((byte)DVar2.field_0 & 0x80 | *(byte *)((long)pvVar3 + 0xee) & 0x7f);
  (ctx->pic_params).frame_refs[2].field_0 =
       (anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_VPx_0)
       ((ctx->pic_params).frame_refs[2].field_0.bPicEntry & 0x80 |
       *(byte *)((long)pvVar3 + 0xef) & 0x7f);
  (ctx->pic_params).ref_frame_sign_bias[1] = *(CHAR *)((long)pvVar3 + 0xf0);
  (ctx->pic_params).ref_frame_sign_bias[2] = *(CHAR *)((long)pvVar3 + 0xf1);
  (ctx->pic_params).ref_frame_sign_bias[3] = *(CHAR *)((long)pvVar3 + 0xf2);
  (ctx->pic_params).filter_level = *(CHAR *)((long)pvVar3 + 0x204);
  (ctx->pic_params).sharpness_level = *(CHAR *)((long)pvVar3 + 0x205);
  bVar12 = (ctx->pic_params).field_16.wControlInfoFlags;
  bVar7 = *(byte *)((long)pvVar3 + 0x286) & 1;
  (ctx->pic_params).field_16.wControlInfoFlags = bVar12 & 0xfe | bVar7;
  bVar8 = *(char *)((long)pvVar3 + 0x287) * '\x02' & 2;
  (ctx->pic_params).field_16.wControlInfoFlags = bVar12 & 0xfc | bVar7 | bVar8;
  (ctx->pic_params).field_16.wControlInfoFlags =
       bVar12 & 0xf8 | bVar7 | bVar8 | (*(byte *)((long)pvVar3 + 0xd8) & 1) << 2;
  (ctx->pic_params).ref_deltas[0] = *(CHAR *)((long)pvVar3 + 0x28a);
  (ctx->pic_params).ref_deltas[1] = *(CHAR *)((long)pvVar3 + 0x28b);
  (ctx->pic_params).ref_deltas[2] = *(CHAR *)((long)pvVar3 + 0x28c);
  (ctx->pic_params).ref_deltas[3] = *(CHAR *)((long)pvVar3 + 0x28d);
  (ctx->pic_params).mode_deltas[0] = *(CHAR *)((long)pvVar3 + 0x288);
  (ctx->pic_params).mode_deltas[1] = *(CHAR *)((long)pvVar3 + 0x289);
  (ctx->pic_params).base_qindex = (ushort)*(byte *)((long)pvVar3 + 0x28e);
  (ctx->pic_params).y_dc_delta_q = *(CHAR *)((long)pvVar3 + 0x28f);
  (ctx->pic_params).uv_dc_delta_q = *(CHAR *)((long)pvVar3 + 0x290);
  (ctx->pic_params).uv_ac_delta_q = *(CHAR *)((long)pvVar3 + 0x291);
  (ctx->pic_params).txmode = *(CHAR *)((long)pvVar3 + 0x6f10);
  (ctx->pic_params).refmode = *(CHAR *)((long)pvVar3 + 0x6f14);
  bVar12 = (ctx->pic_params).stVP9Segments.field_0.wSegmentInfoFlags;
  bVar7 = *(byte *)((long)pvVar3 + 0x294) & 1;
  (ctx->pic_params).stVP9Segments.field_0.wSegmentInfoFlags = bVar12 & 0xfe | bVar7;
  bVar8 = *(char *)((long)pvVar3 + 0x297) * '\x02' & 2;
  (ctx->pic_params).stVP9Segments.field_0.wSegmentInfoFlags = bVar12 & 0xfc | bVar7 | bVar8;
  bVar13 = (*(byte *)((long)pvVar3 + 0x295) & 1) << 2;
  (ctx->pic_params).stVP9Segments.field_0.wSegmentInfoFlags = bVar12 & 0xf8 | bVar7 | bVar8 | bVar13
  ;
  (ctx->pic_params).stVP9Segments.field_0.wSegmentInfoFlags =
       (*(byte *)((long)pvVar3 + 0x296) & 1) << 3 | bVar7 | bVar8 | bVar13;
  lVar26 = 0;
  do {
    (ctx->pic_params).stVP9Segments.tree_probs[lVar26] = *(UCHAR *)((long)pvVar3 + lVar26 + 0x2b6f);
    lVar26 = lVar26 + 1;
  } while (lVar26 != 7);
  (ctx->pic_params).stVP9Segments.pred_probs[0] = *(UCHAR *)((long)pvVar3 + 0x2b76);
  (ctx->pic_params).stVP9Segments.pred_probs[1] = *(UCHAR *)((long)pvVar3 + 0x2b77);
  (ctx->pic_params).stVP9Segments.pred_probs[2] = *(UCHAR *)((long)pvVar3 + 0x2b78);
  pbVar11 = (byte *)((long)pvVar3 + 0x29a);
  lVar26 = -8;
  do {
    *(undefined2 *)((ctx->pic_params).stVP9Segments.feature_mask + lVar26 * 8) =
         *(undefined2 *)(pbVar11 + 6);
    *(short *)((long)((ctx->pic_params).prob.y_mode + -3) + 7 + lVar26 * 8) =
         (short)(char)pbVar11[8];
    *(ushort *)((long)((ctx->pic_params).prob.y_mode + -2) + lVar26 * 8) = (ushort)pbVar11[4];
    bVar12 = pbVar11[3];
    *(ushort *)((long)((ctx->pic_params).prob.y_mode + -2) + 2 + lVar26 * 8) = (ushort)bVar12;
    *(byte *)((long)((ctx->pic_params).prob.y_mode + -2) + 4 + lVar26) =
         bVar12 * '\b' | *pbVar11 | pbVar11[2] << 2 | pbVar11[1] * '\x02';
    pbVar11 = pbVar11 + 0x1a;
    lVar26 = lVar26 + 1;
  } while (lVar26 != 0);
  (ctx->pic_params).log2_tile_cols = *(UCHAR *)((long)pvVar3 + 0x36c);
  (ctx->pic_params).log2_tile_rows = *(UCHAR *)((long)pvVar3 + 0x370);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)((long)pvVar3 + 0x709c);
  auVar29 = pshuflw(auVar29,auVar29,0xe8);
  (ctx->pic_params).uncompressed_header_size_byte_aligned = (short)auVar29._0_4_;
  (ctx->pic_params).first_partition_size = (short)((uint)auVar29._0_4_ >> 0x10);
  *(undefined8 *)(ctx->pic_params).mvscale = *(undefined8 *)((long)pvVar3 + 0x7088);
  (ctx->pic_params).mvscale[2] = *(USHORT (*) [2])((long)pvVar3 + 0x7090);
  memcpy(&(ctx->pic_params).prob,(void *)((long)pvVar3 + 0x2378),0x7f7);
  memcpy(&(ctx->pic_params).prob_flag_delta,(void *)((long)pvVar3 + 0x2b79),0xfee);
  paaRVar20 = (ctx->pic_params).prob_flag_delta.p_delta.partition + 3;
  lVar26 = 0;
  do {
    *(undefined4 *)((long)&uStack_b0 + lVar26) = *(undefined4 *)((long)(paaRVar20 + -0x512) + 9);
    *(undefined8 *)((long)&local_b8 + lVar26) = *(undefined8 *)((long)(paaRVar20 + -0x512) + 1);
    *(undefined8 *)((long)&local_e8 + lVar26) = *(undefined8 *)((long)(paaRVar20 + -0x1a) + 1);
    *(undefined4 *)((long)&uStack_e0 + lVar26) = *(undefined4 *)((long)(paaRVar20 + -0x1a) + 9);
    *(undefined8 *)((long)&local_118 + lVar26) = *(undefined8 *)*paaRVar20;
    *(undefined4 *)((long)&uStack_110 + lVar26) = *(undefined4 *)((*paaRVar20)[2] + 2);
    lVar26 = lVar26 + 0xc;
    paaRVar20 = paaRVar20 + -1;
  } while (lVar26 != 0x30);
  *(undefined8 *)((ctx->pic_params).prob.partition[2][2] + 2) = local_98;
  *(undefined8 *)((ctx->pic_params).prob.partition[3][1] + 1) = uStack_90;
  *(undefined8 *)((ctx->pic_params).prob.partition[1][1] + 1) = local_a8;
  *(undefined8 *)(ctx->pic_params).prob.partition[2] = uStack_a0;
  *(undefined8 *)(ctx->pic_params).prob.partition[0] = local_b8;
  *(undefined8 *)((ctx->pic_params).prob.partition[0][2] + 2) = uStack_b0;
  *(undefined8 *)((ctx->pic_params).prob_flag_delta.p_flag.partition[2][2] + 2) = local_c8;
  *(undefined8 *)((ctx->pic_params).prob_flag_delta.p_flag.partition[3][1] + 1) = uStack_c0;
  *(undefined8 *)((ctx->pic_params).prob_flag_delta.p_flag.partition[1][1] + 1) = local_d8;
  *(undefined8 *)(ctx->pic_params).prob_flag_delta.p_flag.partition[2] = uStack_d0;
  *(undefined8 *)(ctx->pic_params).prob_flag_delta.p_flag.partition[0] = local_e8;
  *(undefined8 *)((ctx->pic_params).prob_flag_delta.p_flag.partition[0][2] + 2) = uStack_e0;
  *(undefined8 *)((ctx->pic_params).prob_flag_delta.p_delta.partition[2][2] + 2) = local_f8;
  *(undefined8 *)((ctx->pic_params).prob_flag_delta.p_delta.partition[3][1] + 1) = uStack_f0;
  *(undefined8 *)((ctx->pic_params).prob_flag_delta.p_delta.partition[1][1] + 1) = local_108;
  *(undefined8 *)(ctx->pic_params).prob_flag_delta.p_delta.partition[2] = uStack_100;
  *(undefined8 *)(ctx->pic_params).prob_flag_delta.p_delta.partition[0] = local_118;
  *(undefined8 *)((ctx->pic_params).prob_flag_delta.p_delta.partition[0][2] + 2) = uStack_110;
  paUVar22 = (ctx->pic_params).prob.uv_mode;
  iVar23 = 0;
  lVar26 = 0;
  do {
    paUVar25 = (ctx->pic_params).prob.uv_mode + 2;
    switch(iVar23) {
    case 0:
      break;
    case 1:
      paUVar25 = paUVar22;
      break;
    case 2:
      paUVar25 = (ctx->pic_params).prob.uv_mode + 1;
      break;
    default:
      paUVar25 = (UCHAR (*) [9])(*paUVar22 + lVar26);
      break;
    case 7:
      paUVar25 = (ctx->pic_params).prob.uv_mode + 8;
      break;
    case 8:
      paUVar25 = (ctx->pic_params).prob.uv_mode + 7;
    }
    aUStack_80[lVar26] = (*paUVar25)[8];
    *(undefined8 *)((long)&local_88 + lVar26) = *(undefined8 *)*paUVar25;
    lVar26 = lVar26 + 9;
    iVar23 = iVar23 + 1;
  } while (lVar26 != 0x5a);
  puVar21 = &local_88;
  for (lVar26 = 0x16; lVar26 != 0; lVar26 = lVar26 + -1) {
    *(undefined4 *)*paUVar22 = *(undefined4 *)puVar21;
    puVar21 = (undefined8 *)((long)puVar21 + ((ulong)bVar28 * -2 + 1) * 4);
    paUVar22 = (UCHAR (*) [9])((long)paUVar22 + (ulong)bVar28 * -8 + 4);
  }
  *(undefined2 *)((ctx->pic_params).prob.uv_mode[9] + 7) = local_30;
  paRVar1 = (ctx->pic_params).prob_flag_delta.p_flag.uv_mode;
  iVar23 = 0;
  lVar26 = 0;
  do {
    paRVar24 = (ctx->pic_params).prob_flag_delta.p_flag.uv_mode + 2;
    switch(iVar23) {
    case 0:
      break;
    case 1:
      paRVar24 = paRVar1;
      break;
    case 2:
      paRVar24 = (ctx->pic_params).prob_flag_delta.p_flag.uv_mode + 1;
      break;
    default:
      paRVar24 = (RK_U8 (*) [9])(*paRVar1 + lVar26);
      break;
    case 7:
      paRVar24 = (ctx->pic_params).prob_flag_delta.p_flag.uv_mode + 8;
      break;
    case 8:
      paRVar24 = (ctx->pic_params).prob_flag_delta.p_flag.uv_mode + 7;
    }
    aUStack_80[lVar26] = (*paRVar24)[8];
    *(undefined8 *)((long)&local_88 + lVar26) = *(undefined8 *)*paRVar24;
    lVar26 = lVar26 + 9;
    iVar23 = iVar23 + 1;
  } while (lVar26 != 0x5a);
  memcpy(paRVar1,&local_88,0x5a);
  paRVar1 = (ctx->pic_params).prob_flag_delta.p_delta.uv_mode;
  iVar23 = 0;
  lVar26 = 0;
  do {
    paRVar24 = (ctx->pic_params).prob_flag_delta.p_delta.uv_mode + 2;
    switch(iVar23) {
    case 0:
      break;
    case 1:
      paRVar24 = paRVar1;
      break;
    case 2:
      paRVar24 = (ctx->pic_params).prob_flag_delta.p_delta.uv_mode + 1;
      break;
    default:
      paRVar24 = (RK_U8 (*) [9])(*paRVar1 + lVar26);
      break;
    case 7:
      paRVar24 = (ctx->pic_params).prob_flag_delta.p_delta.uv_mode + 8;
      break;
    case 8:
      paRVar24 = (ctx->pic_params).prob_flag_delta.p_delta.uv_mode + 7;
    }
    aUStack_80[lVar26] = (*paRVar24)[8];
    *(undefined8 *)((long)&local_88 + lVar26) = *(undefined8 *)*paRVar24;
    lVar26 = lVar26 + 9;
    iVar23 = iVar23 + 1;
  } while (lVar26 != 0x5a);
  memcpy(paRVar1,&local_88,0x5a);
  return 0;
}

Assistant:

RK_S32 vp9d_parser2_syntax(Vp9CodecContext *ctx)
{
    vp9d_fill_picparams(ctx, &ctx->pic_params);
    return 0;
}